

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketPrivate::QSslSocketPrivate(QSslSocketPrivate *this)

{
  bool bVar1;
  QTlsBackend *this_00;
  pointer pTVar2;
  QSslConfigurationPrivate *in_RDI;
  long in_FS_OFFSET;
  QTlsBackend *tlsBackend;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff48;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff50;
  int line;
  QSslConfigurationPrivate *in_stack_ffffffffffffff58;
  QSslCipher *t;
  undefined1 local_88 [32];
  char *in_stack_ffffffffffffff98;
  QDebug local_50;
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTcpSocketPrivate::QTcpSocketPrivate((QTcpSocketPrivate *)in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__QSslSocketPrivate_004a0650;
  in_RDI[1].sessionCipher.d._M_t.
  super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl =
       (QSslCipherPrivate *)&PTR__QSslSocketPrivate_004a06f0;
  *(undefined1 *)((long)&in_RDI[1].nextNegotiatedProtocol.d.ptr + 7) = 0;
  *(undefined4 *)&in_RDI[1].nextNegotiatedProtocol.d.size = 0;
  *(undefined1 *)((long)&in_RDI[1].nextNegotiatedProtocol.d.size + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1].nextNegotiatedProtocol.d.size + 5) = 0;
  *(undefined1 *)((long)&in_RDI[1].nextNegotiatedProtocol.d.size + 6) = 0;
  QList<QSslError>::QList((QList<QSslError> *)0x3a4d09);
  in_RDI[2].peerCertificateChain.d.d = (Data *)0x0;
  QSslConfigurationPrivate::QSslConfigurationPrivate(in_RDI);
  QString::QString((QString *)0x3a4d36);
  *(undefined1 *)&in_RDI[3].localCertificateChain.d.ptr = 1;
  in_RDI[3].localCertificateChain.d.size = 0;
  *(undefined1 *)&in_RDI[3].privateKey.d.d.ptr = 0;
  *(undefined1 *)((long)&in_RDI[3].privateKey.d.d.ptr + 1) = 0;
  std::unique_ptr<QTlsPrivate::TlsCryptograph,std::default_delete<QTlsPrivate::TlsCryptograph>>::
  unique_ptr<std::default_delete<QTlsPrivate::TlsCryptograph>,void>
            ((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
              *)in_stack_ffffffffffffff50);
  QSslConfigurationPrivate::deepCopyDefaultConfiguration(in_stack_ffffffffffffff58);
  if (((ulong)in_RDI[2].ellipticCurves.d.ptr & 0x100000000) == 0) {
    *(undefined1 *)&in_RDI[3].localCertificateChain.d.ptr = 0;
  }
  this_00 = tlsBackendInUse();
  if (this_00 == (QTlsBackend *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a4dfb);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff58,
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(char *)in_stack_ffffffffffffff48,
                 (char *)0x3a4e11);
      QMessageLogger::warning(local_48,"No TLS backend is available");
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    t = &in_RDI[3].sessionCipher;
    (**(code **)(*(long *)this_00 + 200))();
    std::unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
    ::reset((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             *)in_stack_ffffffffffffff50,(pointer)in_stack_ffffffffffffff48);
    pTVar2 = std::
             unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             ::get((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                    *)0x3a4e6f);
    if (pTVar2 == (pointer)0x0) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      while( true ) {
        line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar1) break;
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a4ecf);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RDI,(char *)t,line,(char *)in_stack_ffffffffffffff48,
                   (char *)0x3a4ee5);
        QMessageLogger::warning();
        in_stack_ffffffffffffff50 =
             (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
             QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff98);
        (**(code **)(*(long *)this_00 + 0x90))(local_88);
        QDebug::operator<<((QDebug *)in_RDI,(QString *)t);
        QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff98);
        QString::~QString((QString *)0x3a4f45);
        QDebug::~QDebug(&local_50);
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSslSocketPrivate::QSslSocketPrivate()
    : initialized(false)
    , mode(QSslSocket::UnencryptedMode)
    , autoStartHandshake(false)
    , connectionEncrypted(false)
    , ignoreAllSslErrors(false)
    , readyReadEmittedPointer(nullptr)
    , allowRootCertOnDemandLoading(true)
    , plainSocket(nullptr)
    , paused(false)
    , flushTriggered(false)
{
    QSslConfigurationPrivate::deepCopyDefaultConfiguration(&configuration);
    // If the global configuration doesn't allow root certificates to be loaded
    // on demand then we have to disable it for this socket as well.
    if (!configuration.allowRootCertOnDemandLoading)
        allowRootCertOnDemandLoading = false;

    const auto *tlsBackend = tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return;
    }
    backend.reset(tlsBackend->createTlsCryptograph());
    if (!backend.get()) {
        qCWarning(lcSsl) << "The backend named" << tlsBackend->backendName()
                         << "does not support TLS";
    }
}